

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::X3DImporter::FindNodeElement_FromNode
          (X3DImporter *this,CX3DImporter_NodeElement *pStartNode,string *pID,EType pType,
          CX3DImporter_NodeElement **pElement)

{
  __type _Var1;
  bool bVar2;
  reference ppCVar3;
  _Self local_48;
  _Self local_40;
  iterator ch_it;
  bool found;
  CX3DImporter_NodeElement **pElement_local;
  EType pType_local;
  string *pID_local;
  CX3DImporter_NodeElement *pStartNode_local;
  X3DImporter *this_local;
  
  ch_it._M_node._7_1_ = 0;
  if ((pStartNode->Type == pType) && (_Var1 = std::operator==(&pStartNode->ID,pID), _Var1)) {
    ch_it._M_node._7_1_ = 1;
    if (pElement != (CX3DImporter_NodeElement **)0x0) {
      *pElement = pStartNode;
    }
  }
  else {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
         ::begin(&pStartNode->Child);
    while( true ) {
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                     (&pStartNode->Child);
      bVar2 = std::operator!=(&local_40,&local_48);
      if (!bVar2) break;
      ppCVar3 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_40);
      ch_it._M_node._7_1_ = FindNodeElement_FromNode(this,*ppCVar3,pID,pType,pElement);
      if ((bool)ch_it._M_node._7_1_) break;
      std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_40);
    }
  }
  return (bool)(ch_it._M_node._7_1_ & 1);
}

Assistant:

bool X3DImporter::FindNodeElement_FromNode(CX3DImporter_NodeElement* pStartNode, const std::string& pID,
													const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
    bool found = false;// flag: true - if requested element is found.

	// Check if pStartNode - this is the element, we are looking for.
	if((pStartNode->Type == pType) && (pStartNode->ID == pID))
	{
		found = true;
        if ( pElement != nullptr )
        {
            *pElement = pStartNode;
        }

		goto fne_fn_end;
	}// if((pStartNode->Type() == pType) && (pStartNode->ID() == pID))

	// Check childs of pStartNode.
	for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = pStartNode->Child.begin(); ch_it != pStartNode->Child.end(); ++ch_it)
	{
		found = FindNodeElement_FromNode(*ch_it, pID, pType, pElement);
        if ( found )
        {
            break;
        }
	}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = it->Child.begin(); ch_it != it->Child.end(); ch_it++)

fne_fn_end:

	return found;
}